

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void * ShrinkUnits(CPpmd8 *p,void *oldPtr,uint oldNU,uint newNU)

{
  uint oldIndx;
  uint newIndx;
  uint local_4c;
  UInt32 *pUStack_48;
  UInt32 n;
  UInt32 *z;
  UInt32 *d;
  void *ptr;
  uint i1;
  uint i0;
  uint newNU_local;
  uint oldNU_local;
  void *oldPtr_local;
  CPpmd8 *p_local;
  
  oldIndx = (uint)p->Units2Indx[oldNU - 1];
  newIndx = (uint)p->Units2Indx[newNU - 1];
  p_local = (CPpmd8 *)oldPtr;
  if (oldIndx != newIndx) {
    if (p->FreeList[newIndx] == 0) {
      SplitBlock(p,oldPtr,oldIndx,newIndx);
    }
    else {
      p_local = (CPpmd8 *)RemoveNode(p,newIndx);
      local_4c = newNU;
      pUStack_48 = (UInt32 *)oldPtr;
      z = (UInt32 *)p_local;
      do {
        *z = *pUStack_48;
        z[1] = pUStack_48[1];
        z[2] = pUStack_48[2];
        pUStack_48 = pUStack_48 + 3;
        z = z + 3;
        local_4c = local_4c - 1;
      } while (local_4c != 0);
      InsertNode(p,oldPtr,oldIndx);
    }
  }
  return p_local;
}

Assistant:

static void *ShrinkUnits(CPpmd8 *p, void *oldPtr, unsigned oldNU, unsigned newNU)
{
  unsigned i0 = U2I(oldNU);
  unsigned i1 = U2I(newNU);
  if (i0 == i1)
    return oldPtr;
  if (p->FreeList[i1] != 0)
  {
    void *ptr = RemoveNode(p, i1);
    MyMem12Cpy(ptr, oldPtr, newNU);
    InsertNode(p, oldPtr, i0);
    return ptr;
  }
  SplitBlock(p, oldPtr, i0, i1);
  return oldPtr;
}